

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_remove_conn(connectdata *conn,_Bool lock)

{
  Curl_easy *data_00;
  connectbundle *cb_ptr;
  conncache *connc_00;
  conncache *connc;
  connectbundle *bundle;
  Curl_easy *data;
  _Bool lock_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  cb_ptr = conn->bundle;
  connc_00 = (data_00->state).conn_cache;
  if (cb_ptr != (connectbundle *)0x0) {
    if ((lock) && (data_00->share != (Curl_share *)0x0)) {
      Curl_share_lock(data_00,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    bundle_remove_conn(cb_ptr,conn);
    if (cb_ptr->num_connections == 0) {
      conncache_remove_bundle(connc_00,cb_ptr);
    }
    conn->bundle = (connectbundle *)0x0;
    if (connc_00 != (conncache *)0x0) {
      connc_00->num_conn = connc_00->num_conn - 1;
    }
    if ((lock) && (data_00->share != (Curl_share *)0x0)) {
      Curl_share_unlock(data_00,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct connectdata *conn, bool lock)
{
  struct Curl_easy *data = conn->data;
  struct connectbundle *bundle = conn->bundle;
  struct conncache *connc = data->state.conn_cache;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    if(lock) {
      CONN_LOCK(data);
    }
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0)
      conncache_remove_bundle(connc, bundle);
    conn->bundle = NULL; /* removed from it */
    if(connc) {
      connc->num_conn--;
      DEBUGF(infof(data, "The cache now contains %zu members\n",
                   connc->num_conn));
    }
    if(lock) {
      CONN_UNLOCK(data);
    }
  }
}